

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O3

Frc_Man_t * Frc_ManStart(Gia_Man_t *pGia)

{
  Frc_Obj_t *pObj;
  uint uVar1;
  Gia_Obj_t *pGVar2;
  uint uVar3;
  Frc_Man_t *pFVar4;
  Vec_Int_t *p;
  int *piVar5;
  Vec_Int_t *p_00;
  uint *puVar6;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  Vec_Int_t *vVisit;
  int *piVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  int nFanios;
  int nObjs;
  int local_84;
  int local_58;
  uint local_54;
  Frc_Man_t *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  Frc_ManCreateRefsSpecial(pGia);
  Frc_ManTransformRefs(pGia,(int *)&local_54,&local_58);
  Gia_ManFillValue(pGia);
  pFVar4 = (Frc_Man_t *)calloc(1,0x38);
  pFVar4->pGia = pGia;
  pFVar4->nRegs = pGia->nRegs;
  pVVar8 = pGia->vCis;
  iVar11 = pVVar8->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar10 = iVar11;
  if (iVar11 - 1U < 0xf) {
    iVar10 = 0x10;
  }
  p->nSize = 0;
  p->nCap = iVar10;
  if (iVar10 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar10 << 2);
  }
  p->pArray = piVar5;
  pFVar4->vCis = p;
  iVar10 = pGia->vCos->nSize;
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar13 = 0x10;
  if (0xe < iVar10 - 1U) {
    iVar13 = iVar10;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar13;
  if (iVar13 == 0) {
    piVar5 = (int *)0x0;
  }
  else {
    piVar5 = (int *)malloc((long)iVar13 << 2);
  }
  p_00->pArray = piVar5;
  pFVar4->vCos = p_00;
  local_40 = (ulong)local_54;
  uVar1 = local_54 * 6 + local_58 * 2;
  pFVar4->nObjData = uVar1;
  puVar6 = (uint *)calloc((long)(int)uVar1,4);
  pFVar4->pObjData = (int *)puVar6;
  pGVar7 = pGia->pObjs;
  pGVar7->Value = 0;
  *puVar6 = *puVar6 & 0xf;
  uVar14 = (ulong)(uint)pGia->nObjs;
  if (pGia->nObjs < 1) {
LAB_0073fa61:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar18 = *pGia->pRefs;
  puVar6[1] = uVar18;
  uVar16 = (ulong)(uVar18 + 6);
  pFVar4->nObjs = 1;
  local_84 = 1;
  if (iVar11 < 1) {
    iVar11 = 1;
  }
  else {
    lVar12 = 0;
    do {
      iVar11 = pVVar8->pArray[lVar12];
      if (((long)iVar11 < 0) || ((int)uVar14 <= iVar11)) goto LAB_0073fa42;
      if (pGVar7 == (Gia_Obj_t *)0x0) break;
      pGVar2 = pGVar7 + iVar11;
      uVar3 = (uint)uVar16;
      pGVar2->Value = uVar3;
      Vec_IntPush(p,uVar3);
      puVar6[(long)(int)uVar3 + 3] = uVar3;
      uVar18 = puVar6[(int)uVar3];
      puVar6[(int)uVar3] = uVar18 & 0xf;
      pGVar7 = pGia->pObjs;
      if ((pGVar2 < pGVar7) || (uVar14 = (ulong)pGia->nObjs, pGVar7 + uVar14 <= pGVar2))
      goto LAB_0073fa61;
      uVar17 = pGia->pRefs[(int)((ulong)((long)pGVar2 - (long)pGVar7) >> 2) * -0x55555555];
      puVar6[(long)(int)uVar3 + 1] = uVar17;
      puVar6[(int)uVar3] = uVar18 & 0xf | 1;
      uVar16 = (ulong)(uVar3 + uVar17 + 6);
      pFVar4->nObjs = (int)lVar12 + 2;
      lVar12 = lVar12 + 1;
      pVVar8 = pGia->vCis;
    } while (lVar12 < pVVar8->nSize);
    iVar11 = (int)lVar12 + 1;
  }
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  piVar5 = (int *)malloc(400);
  pVVar8->pArray = piVar5;
  vVisit = (Vec_Int_t *)malloc(0x10);
  vVisit->nCap = 100;
  vVisit->nSize = 0;
  piVar9 = (int *)malloc(400);
  vVisit->pArray = piVar9;
  if (0 < (int)uVar14) {
    local_84 = 1;
    lVar12 = 0;
    local_50 = pFVar4;
    do {
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar7 = pGia->pObjs + lVar12;
      uVar18 = (uint)*(undefined8 *)pGVar7;
      if ((~uVar18 & 0x1fffffff) != 0 && -1 < (int)uVar18) {
        if ((uVar18 >> 0x1e & 1) == 0) {
          if (pGia->pRefs[lVar12] != 0) {
            __assert_fail("Gia_ObjRefNum( pGia, pObj ) == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                          ,0x1e1,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
          }
        }
        else {
          if (pGia->pRefs[lVar12] < 1) {
            __assert_fail("Gia_ObjRefNum( pGia, pObj ) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                          ,0x1e4,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
          }
          Frc_ManCollectSuper(pGia,pGVar7,pVVar8,vVisit);
          uVar17 = (uint)uVar16;
          pGVar7->Value = uVar17;
          puVar6[(long)(int)uVar17 + 3] = uVar17;
          uVar18 = pVVar8->nSize;
          local_48 = (ulong)uVar18;
          uVar3 = puVar6[(int)uVar17] & 0xf | uVar18 << 4;
          puVar6[(int)uVar17] = uVar3;
          pGVar2 = pGia->pObjs;
          if ((pGVar7 < pGVar2) || (uVar14 = (ulong)pGia->nObjs, pGVar2 + uVar14 <= pGVar7))
          goto LAB_0073fa61;
          pObj = (Frc_Obj_t *)(puVar6 + (int)uVar17);
          uVar17 = pGia->pRefs[(int)((ulong)((long)pGVar7 - (long)pGVar2) >> 2) * -0x55555555];
          pObj->nFanouts = uVar17;
          if (0 < (int)uVar18) {
            piVar5 = pVVar8->pArray;
            uVar14 = 0;
            local_38 = uVar16;
            do {
              iVar10 = piVar5[uVar14];
              if (((long)iVar10 < 0) || (uVar18 = pGia->nObjs, (int)uVar18 <= iVar10))
              goto LAB_0073fa42;
              if (pGia->pObjs == (Gia_Obj_t *)0x0) goto LAB_0073f816;
              Frc_ObjAddFanin(pObj,(Frc_Obj_t *)(puVar6 + (int)pGia->pObjs[iVar10].Value));
              uVar14 = uVar14 + 1;
            } while (local_48 != uVar14);
            uVar18 = pGia->nObjs;
LAB_0073f816:
            uVar14 = (ulong)uVar18;
            uVar3 = *(uint *)pObj;
            uVar17 = pObj->nFanouts;
            uVar16 = local_38;
          }
          uVar16 = (ulong)((int)uVar16 + (uVar3 >> 4) + uVar17 + 6);
          local_84 = local_84 + 1;
          iVar11 = iVar11 + 1;
          local_50->nObjs = iVar11;
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (int)uVar14);
    piVar5 = pVVar8->pArray;
    pFVar4 = local_50;
  }
  uVar18 = (uint)uVar16;
  if (piVar5 != (int *)0x0) {
    free(piVar5);
  }
  free(pVVar8);
  if (vVisit->pArray != (int *)0x0) {
    free(vVisit->pArray);
  }
  free(vVisit);
  pVVar8 = pGia->vCos;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      uVar18 = (uint)uVar16;
      iVar10 = pVVar8->pArray[lVar12];
      if (((long)iVar10 < 0) || (pGia->nObjs <= iVar10)) {
LAB_0073fa42:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar7 = pGia->pObjs + iVar10;
      pGVar7->Value = uVar18;
      Vec_IntPush(p_00,uVar18);
      puVar6[(long)(int)uVar18 + 3] = uVar18;
      uVar3 = puVar6[(int)uVar18];
      puVar6[(long)(int)uVar18 + 1] = 0;
      puVar6[(int)uVar18] = uVar3 & 0xd | 0x12;
      Frc_ObjAddFanin((Frc_Obj_t *)(puVar6 + (int)uVar18),
                      (Frc_Obj_t *)
                      (puVar6 + (int)pGVar7[-(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff)].
                                     Value));
      uVar18 = puVar6[(long)(int)uVar18 + 1] + (puVar6[(int)uVar18] >> 4) + uVar18 + 6;
      uVar16 = (ulong)uVar18;
      iVar11 = iVar11 + 1;
      pFVar4->nObjs = iVar11;
      lVar12 = lVar12 + 1;
      pVVar8 = pGia->vCos;
    } while (lVar12 < pVVar8->nSize);
  }
  Gia_ManCleanMark0(pGia);
  if (local_84 != iVar11 - (p->nSize + p_00->nSize)) {
    __assert_fail("nNodes == Frc_ManNodeNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                  ,0x20f,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
  }
  if ((int)local_40 != iVar11) {
    __assert_fail("nObjs == p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                  ,0x210,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
  }
  if (uVar18 != uVar1) {
    __assert_fail("hHandle == p->nObjData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                  ,0x211,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
  }
  uVar1 = pGia->nObjs;
  if ((0 < (int)uVar1) && (pGVar7 = pGia->pObjs, pGVar7 != (Gia_Obj_t *)0x0)) {
    lVar12 = 0;
    do {
      lVar15 = (long)*(int *)((long)&pGVar7->Value + lVar12);
      if (lVar15 != -1) {
        if (puVar6[lVar15] >> 4 != puVar6[lVar15 + 5]) {
          __assert_fail("pObjLog->nFanins == pObjLog->iFanin",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                        ,0x21a,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
        }
        if (puVar6[lVar15 + 1] != puVar6[lVar15 + 2]) {
          __assert_fail("pObjLog->nFanouts == pObjLog->iFanout",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaForce.c"
                        ,0x21b,"Frc_Man_t *Frc_ManStart(Gia_Man_t *)");
        }
        puVar6[lVar15 + 2] = 0;
        puVar6[lVar15 + 5] = 0;
      }
      lVar12 = lVar12 + 0xc;
    } while ((ulong)uVar1 * 0xc != lVar12);
  }
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  return pFVar4;
}

Assistant:

Frc_Man_t * Frc_ManStart( Gia_Man_t * pGia )
{
    Frc_Man_t * p;
    Frc_Obj_t * pObjLog, * pFanLog;
    Gia_Obj_t * pObj, * pFanin;//, * pObjRi, * pObjRo;
    Vec_Int_t * vSuper, * vVisit;
    int nObjs, nFanios, nNodes = 0;
    int i, k, hHandle = 0;
    // prepare the AIG
//    Gia_ManCreateRefs( pGia );
    Frc_ManCreateRefsSpecial( pGia );
    Frc_ManTransformRefs( pGia, &nObjs, &nFanios );
    Gia_ManFillValue( pGia );
    // create logic network
    p = ABC_CALLOC( Frc_Man_t, 1 );
    p->pGia  = pGia;
    p->nRegs = Gia_ManRegNum(pGia);
    p->vCis  = Vec_IntAlloc( Gia_ManCiNum(pGia) );
    p->vCos  = Vec_IntAlloc( Gia_ManCoNum(pGia) );
    p->nObjData = (sizeof(Frc_Obj_t) / 4) * nObjs + 2 * nFanios;
    p->pObjData = ABC_CALLOC( int, p->nObjData );
    // create constant node
    Gia_ManConst0(pGia)->Value = hHandle;
    pObjLog = Frc_ManObj( p, hHandle );
    pObjLog->hHandle  = hHandle;
    pObjLog->nFanins  = 0;
    pObjLog->nFanouts = Gia_ObjRefNum( pGia, Gia_ManConst0(pGia) );
    // count objects
    hHandle += Frc_ObjSize( pObjLog );
    nNodes++;
    p->nObjs++;
    // create the PIs
    Gia_ManForEachCi( pGia, pObj, i )
    {
        // create PI object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCis, hHandle );
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 0;
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        pObjLog->fCi = 1;
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        p->nObjs++;
    }
    // create internal nodes
    vSuper = Vec_IntAlloc( 100 );
    vVisit = Vec_IntAlloc( 100 );
    Gia_ManForEachAnd( pGia, pObj, i )
    {
        if ( pObj->fMark0 == 0 )
        {
            assert( Gia_ObjRefNum( pGia, pObj ) == 0 );
            continue;
        }
        assert( Gia_ObjRefNum( pGia, pObj ) > 0 );
        Frc_ManCollectSuper( pGia, pObj, vSuper, vVisit );
        // create node object
        pObj->Value = hHandle;
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = Vec_IntSize( vSuper );
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        // add fanins
        Gia_ManForEachObjVec( vSuper, pGia, pFanin, k )
        {
            pFanLog = Frc_ManObj( p, Gia_ObjValue(pFanin) ); 
            Frc_ObjAddFanin( pObjLog, pFanLog );
        }
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        nNodes++;
        p->nObjs++;
    }
    Vec_IntFree( vSuper );
    Vec_IntFree( vVisit );
    // create the POs
    Gia_ManForEachCo( pGia, pObj, i )
    {
        // create PO object
        pObj->Value = hHandle;
        Vec_IntPush( p->vCos, hHandle );
        pObjLog = Frc_ManObj( p, hHandle );
        pObjLog->hHandle  = hHandle;
        pObjLog->nFanins  = 1;
        pObjLog->nFanouts = 0;
        pObjLog->fCo = 1;
        // add fanins
        pFanLog = Frc_ManObj( p, Gia_ObjValue(Gia_ObjFanin0(pObj)) );
        Frc_ObjAddFanin( pObjLog, pFanLog );
        // count objects
        hHandle += Frc_ObjSize( pObjLog );
        p->nObjs++;
    }
    // connect registers
//    Gia_ManForEachRiRo( pGia, pObjRi, pObjRo, i )
//        Frc_ObjAddFanin( Frc_ManObj(p,Gia_ObjValue(pObjRo)), Frc_ManObj(p,Gia_ObjValue(pObjRi)) );
    Gia_ManCleanMark0( pGia );
    assert( nNodes  == Frc_ManNodeNum(p) );
    assert( nObjs   == p->nObjs );
    assert( hHandle == p->nObjData );
    if ( hHandle != p->nObjData )
        printf( "Frc_ManStart(): Fatal error in internal representation.\n" );
    // make sure the fanin/fanout counters are correct
    Gia_ManForEachObj( pGia, pObj, i )
    {
        if ( !~Gia_ObjValue(pObj) )
            continue;
        pObjLog = Frc_ManObj( p, Gia_ObjValue(pObj) );
        assert( pObjLog->nFanins  == pObjLog->iFanin );
        assert( pObjLog->nFanouts == pObjLog->iFanout );
        pObjLog->iFanin = pObjLog->iFanout = 0;
    }
    ABC_FREE( pGia->pRefs );
    return p;
}